

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IndexFreeArray(Fts5Data **ap,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  if (ap != (Fts5Data **)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)n;
    if (n < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      sqlite3_free(ap[uVar2]);
    }
    sqlite3_free(ap);
    return;
  }
  return;
}

Assistant:

static void fts5IndexFreeArray(Fts5Data **ap, int n){
  if( ap ){
    int ii;
    for(ii=0; ii<n; ii++){
      fts5DataRelease(ap[ii]);
    }
    sqlite3_free(ap);
  }
}